

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ech_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  CBB ech_body;
  
  if (type == ssl_client_hello_inner) {
    iVar1 = CBB_add_u16(out,0xfe0d);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16(out,1), iVar1 != 0)) {
      iVar1 = CBB_add_u8(out,'\x01');
LAB_00135af2:
      return iVar1 != 0;
    }
  }
  else {
    if ((hs->ech_client_outer).size_ == 0) {
      return true;
    }
    iVar1 = CBB_add_u16(out,0xfe0d);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&ech_body), iVar1 != 0)) {
      iVar1 = CBB_add_u8(&ech_body,'\0');
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_add_bytes(&ech_body,(hs->ech_client_outer).data_,(hs->ech_client_outer).size_);
      if (iVar1 != 0) {
        iVar1 = CBB_flush(out);
        goto LAB_00135af2;
      }
    }
  }
  return false;
}

Assistant:

static bool ext_ech_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  if (type == ssl_client_hello_inner) {
    if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
        !CBB_add_u16(out, /* length */ 1) ||
        !CBB_add_u8(out, ECH_CLIENT_INNER)) {
      return false;
    }
    return true;
  }

  if (hs->ech_client_outer.empty()) {
    return true;
  }

  CBB ech_body;
  if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
      !CBB_add_u16_length_prefixed(out, &ech_body) ||
      !CBB_add_u8(&ech_body, ECH_CLIENT_OUTER) ||
      !CBB_add_bytes(&ech_body, hs->ech_client_outer.data(),
                     hs->ech_client_outer.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}